

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowFirstValueExecutor::EvaluateInternal
          (WindowFirstValueExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  WindowExcludeMode WVar1;
  ulong uVar2;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> _Var3;
  WindowCollection *r;
  type this_00;
  const_reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  long lVar7;
  pointer this_01;
  idx_t row_idx_00;
  int iVar8;
  iterator __begin3;
  WindowExecutorLocalState *pWVar9;
  ulong uVar10;
  WindowCursor *pWVar11;
  size_type __n;
  ulong uVar12;
  idx_t target_offset;
  iterator __end3;
  bool bVar13;
  pair<unsigned_long,_unsigned_long> pVar14;
  SubFrames *__range3;
  idx_t local_68;
  data_ptr_t local_60;
  idx_t local_58;
  data_ptr_t local_50;
  data_ptr_t local_48;
  data_ptr_t local_40;
  WindowExecutor *local_38;
  
  this_00 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
            operator*(&lstate[0x15].range_cursor);
  pWVar9 = lstate + 2;
  optional_ptr<duckdb::ValidityMask,_true>::CheckValid
            ((optional_ptr<duckdb::ValidityMask,_true> *)&gstate[2].executor);
  local_38 = gstate[2].executor;
  WVar1 = gstate->executor->wexpr->exclude_clause;
  pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar9,6);
  local_40 = pvVar4->data;
  pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar9,7);
  local_48 = pvVar4->data;
  pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar9,2);
  local_50 = pvVar4->data;
  pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar9,3);
  if (count != 0) {
    pWVar9 = lstate + 0x14;
    local_60 = pvVar4->data;
    target_offset = 0;
    local_58 = count;
    do {
      uVar10 = *(ulong *)(local_40 + target_offset * 8);
      uVar2 = *(ulong *)(local_48 + target_offset * 8);
      if (WVar1 == NO_OTHER) {
        __n = 0;
      }
      else {
        uVar6 = row_idx;
        if (WVar1 != CURRENT_ROW) {
          uVar6 = *(ulong *)(local_50 + target_offset * 8);
        }
        if (uVar2 <= uVar6) {
          uVar6 = uVar2;
        }
        if (uVar6 <= uVar10) {
          uVar6 = uVar10;
        }
        pvVar5 = vector<duckdb::FrameBounds,_true>::operator[]
                           ((vector<duckdb::FrameBounds,_true> *)pWVar9,0);
        pvVar5->start = uVar10;
        pvVar5->end = uVar6;
        __n = 1;
        if (WVar1 == TIES) {
          uVar6 = uVar10;
          if (uVar10 < row_idx) {
            uVar6 = row_idx;
          }
          if (uVar2 <= uVar6) {
            uVar6 = uVar2;
          }
          uVar12 = row_idx + 1;
          if (uVar2 <= row_idx + 1) {
            uVar12 = uVar2;
          }
          if (uVar12 <= uVar10) {
            uVar12 = uVar10;
          }
          pvVar5 = vector<duckdb::FrameBounds,_true>::operator[]
                             ((vector<duckdb::FrameBounds,_true> *)pWVar9,1);
          pvVar5->start = uVar6;
          pvVar5->end = uVar12;
          __n = 2;
          count = local_58;
        }
        if (WVar1 == CURRENT_ROW) {
          uVar6 = row_idx + 1;
        }
        else {
          uVar6 = *(ulong *)(local_60 + target_offset * 8);
        }
        if (uVar10 < uVar6) {
          uVar10 = uVar6;
        }
        if (uVar2 <= uVar10) {
          uVar10 = uVar2;
        }
      }
      pvVar5 = vector<duckdb::FrameBounds,_true>::operator[]
                         ((vector<duckdb::FrameBounds,_true> *)pWVar9,__n);
      pvVar5->start = uVar10;
      pvVar5->end = uVar2;
      pWVar11 = (WindowCursor *)lstate[0x14].super_WindowExecutorState._vptr_WindowExecutorState;
      _Var3._M_head_impl =
           lstate[0x14].range_cursor.
           super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
           super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
           .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
      if (gstate[2].partition_mask == (ValidityMask *)0x0) {
        if (pWVar11 != _Var3._M_head_impl) {
          bVar13 = false;
          do {
            r = (WindowCollection *)(pWVar11->state).current_chunk_state.handles._M_h._M_buckets;
            iVar8 = 5;
            if (pWVar11->paged < r) {
              local_68 = 1;
              row_idx_00 = WindowBoundariesState::FindNextStart
                                     ((ValidityMask *)local_38,(idx_t)pWVar11->paged,(idx_t)r,
                                      &local_68);
              iVar8 = 0;
              if (local_68 == 0) {
                WindowCursor::CopyCell(this_00,0,row_idx_00,result,target_offset);
                iVar8 = 1;
              }
            }
            if ((iVar8 != 5) && (iVar8 != 0)) {
              if (!bVar13) goto LAB_017ccc0d;
              break;
            }
            pWVar11 = (WindowCursor *)((long)&(pWVar11->state).current_chunk_state.handles._M_h + 8)
            ;
            bVar13 = pWVar11 == _Var3._M_head_impl;
          } while (!bVar13);
        }
LAB_017ccbfb:
        FlatVector::SetNull(result,target_offset,true);
      }
      else {
        if (pWVar11 == _Var3._M_head_impl) goto LAB_017ccbfb;
        lVar7 = 0;
        do {
          lVar7 = *(long *)&(pWVar11->state).current_chunk_state.handles._M_h +
                  (lVar7 - (long)pWVar11->paged);
          pWVar11 = (WindowCursor *)((long)&(pWVar11->state).current_chunk_state.handles + 8);
        } while (pWVar11 != _Var3._M_head_impl);
        if (lVar7 == 0) goto LAB_017ccbfb;
        this_01 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                  ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                                *)&gstate[2].partition_mask);
        pVar14 = WindowIndexTree::SelectNth(this_01,(SubFrames *)pWVar9,0);
        WindowCursor::CopyCell(this_00,0,pVar14.first,result,target_offset);
      }
LAB_017ccc0d:
      target_offset = target_offset + 1;
      row_idx = row_idx + 1;
    } while (target_offset != count);
  }
  return;
}

Assistant:

void WindowFirstValueExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                                DataChunk &eval_chunk, Vector &result, idx_t count,
                                                idx_t row_idx) const {
	auto &gvstate = gstate.Cast<WindowValueGlobalState>();
	auto &lvstate = lstate.Cast<WindowValueLocalState>();
	auto &cursor = *lvstate.cursor;
	auto &bounds = lvstate.bounds;
	auto &frames = lvstate.frames;
	auto &ignore_nulls = *gvstate.ignore_nulls;
	auto exclude_mode = gvstate.executor.wexpr.exclude_clause;
	WindowAggregator::EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t i) {
		if (gvstate.value_tree) {
			idx_t frame_width = 0;
			for (const auto &frame : frames) {
				frame_width += frame.end - frame.start;
			}

			if (frame_width) {
				const auto first_idx = gvstate.value_tree->SelectNth(frames, 0);
				D_ASSERT(first_idx.second == 0);
				cursor.CopyCell(0, first_idx.first, result, i);
			} else {
				FlatVector::SetNull(result, i, true);
			}
			return;
		}

		for (const auto &frame : frames) {
			if (frame.start >= frame.end) {
				continue;
			}

			//	Same as NTH_VALUE(..., 1)
			idx_t n = 1;
			const auto first_idx = WindowBoundariesState::FindNextStart(ignore_nulls, frame.start, frame.end, n);
			if (!n) {
				cursor.CopyCell(0, first_idx, result, i);
				return;
			}
		}

		// Didn't find one
		FlatVector::SetNull(result, i, true);
	});
}